

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::Mixin::_InternalSerialize(Mixin *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint8_t *puVar2;
  char *in_R9;
  string *_s;
  undefined8 *puVar3;
  string_view s;
  string_view s_00;
  string_view field_name;
  string_view field_name_00;
  
  if ((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x1) !=
      (undefined1  [24])0x0) {
    puVar3 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    if ((char *)puVar3[1] != (char *)0x0) {
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"google.protobuf.Mixin.name";
      protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar3,(char *)puVar3[1],1,0x1a,field_name);
      s._M_str = (char *)*puVar3;
      s._M_len = puVar3[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
    }
  }
  if ((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x2) !=
      (undefined1  [24])0x0) {
    puVar3 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.root_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    if ((char *)puVar3[1] != (char *)0x0) {
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)"google.protobuf.Mixin.root";
      protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar3,(char *)puVar3[1],1,0x1a,field_name_00);
      s_00._M_str = (char *)*puVar3;
      s_00._M_len = puVar3[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s_00,target);
    }
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Mixin::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Mixin& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Mixin)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // string name = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._internal_name().empty()) {
      const ::std::string& _s = this_._internal_name();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Mixin.name");
      target = stream->WriteStringMaybeAliased(1, _s, target);
    }
  }

  // string root = 2;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._internal_root().empty()) {
      const ::std::string& _s = this_._internal_root();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Mixin.root");
      target = stream->WriteStringMaybeAliased(2, _s, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Mixin)
  return target;
}